

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O2

void __thiscall GraphContigger::extend_to_repeats(GraphContigger *this,int max_size)

{
  sgNodeID_t node;
  pointer pLVar1;
  uint64_t uVar2;
  ulong uVar3;
  pointer this_00;
  pointer pLVar4;
  long lVar5;
  long lVar6;
  NodeView nv;
  _Vector_base<LinkView,_std::allocator<LinkView>_> local_210;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> through;
  sgNodeID_t fwn;
  _Vector_base<LinkView,_std::allocator<LinkView>_> local_1b8;
  _Vector_base<NodeView,_std::allocator<NodeView>_> local_1a0;
  sgNodeID_t local_188;
  DistanceGraph *pDStack_180;
  NodeView local_178;
  NodeView local_168;
  _Vector_base<NodeView,_std::allocator<NodeView>_> local_158;
  NodeView local_140;
  _Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_130;
  GraphEditor ge;
  
  GraphEditor::GraphEditor(&ge,*(WorkSpace **)this);
  DistanceGraph::get_all_nodeviews
            ((vector<NodeView,_std::allocator<NodeView>_> *)&local_1a0,*(DistanceGraph **)this,false
             ,true);
  this_00 = local_1a0._M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_00 == local_1a0._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<NodeView,_std::allocator<NodeView>_>::~_Vector_base(&local_1a0);
      GraphEditor::apply_all(&ge);
      GraphEditor::~GraphEditor(&ge);
      return;
    }
    local_188 = this_00->id;
    pDStack_180 = this_00->dg;
    local_178 = NodeView::rc(this_00);
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 0x10) {
      nv.id = *(sgNodeID_t *)((long)&local_188 + lVar5);
      nv.dg = *(DistanceGraph **)((long)&pDStack_180 + lVar5);
      uVar2 = NodeView::size(&nv);
      if (uVar2 <= (ulong)(long)max_size) {
        NodeView::prev((vector<LinkView,_std::allocator<LinkView>_> *)&through,&nv);
        if ((ulong)(((long)through.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)through.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28) < 2) {
          std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base
                    ((_Vector_base<LinkView,_std::allocator<LinkView>_> *)&through);
        }
        else {
          NodeView::next((vector<LinkView,_std::allocator<LinkView>_> *)&local_210,&nv);
          lVar6 = (long)local_210._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_210._M_impl.super__Vector_impl_data._M_start;
          std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_210);
          std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base
                    ((_Vector_base<LinkView,_std::allocator<LinkView>_> *)&through);
          if (lVar6 == 0x28) {
            NodeView::next((vector<LinkView,_std::allocator<LinkView>_> *)&through,&nv);
            lVar6 = (through.
                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first;
            std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base
                      ((_Vector_base<LinkView,_std::allocator<LinkView>_> *)&through);
            through.
            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            through.
            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            through.
            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            fwn = lVar6;
            NodeView::prev((vector<LinkView,_std::allocator<LinkView>_> *)&local_210,&nv);
            pLVar1 = local_210._M_impl.super__Vector_impl_data._M_finish;
            for (pLVar4 = local_210._M_impl.super__Vector_impl_data._M_start; pLVar4 != pLVar1;
                pLVar4 = pLVar4 + 1) {
              local_140.id = (pLVar4->node_view).id;
              local_140.dg = (pLVar4->node_view).dg;
              NodeView::next((vector<LinkView,_std::allocator<LinkView>_> *)&local_1b8,&local_140);
              if (1 < (ulong)(((long)local_1b8._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1b8._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
                std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_1b8);
LAB_0021dec6:
                std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_210);
                goto LAB_0021deda;
              }
              local_168.id = (pLVar4->node_view).id;
              local_168.dg = (pLVar4->node_view).dg;
              NodeView::parallels((vector<NodeView,_std::allocator<NodeView>_> *)&local_158,
                                  &local_168);
              uVar3 = (long)local_158._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_158._M_impl.super__Vector_impl_data._M_start;
              std::_Vector_base<NodeView,_std::allocator<NodeView>_>::~_Vector_base(&local_158);
              std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_1b8);
              if (0x10 < uVar3) goto LAB_0021dec6;
              local_1b8._M_impl.super__Vector_impl_data._M_start = (pointer)-(pLVar4->node_view).id;
              std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
              emplace_back<long,long&>
                        ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                         &through,(long *)&local_1b8,&fwn);
            }
            std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_210);
            node = nv.id;
            std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       &local_130,&through);
            GraphEditor::queue_node_expansion
                      (&ge,node,(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                 *)&local_130);
            std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
            ~_Vector_base(&local_130);
LAB_0021deda:
            std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
            ~_Vector_base((_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           *)&through);
          }
        }
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void GraphContigger::extend_to_repeats(int max_size) {
    GraphEditor ge(ws);
    for (auto &fnv:ws.sdg.get_all_nodeviews()){
        for (auto nv:{fnv,fnv.rc()} ){
            if (nv.size()>max_size) continue;
            if (nv.prev().size()<2 or nv.next().size()!=1) continue;
            auto fwn=nv.next()[0].node().node_id();
            bool b=false;
            std::vector<std::pair<sgNodeID_t ,sgNodeID_t >> through;
            for (auto &lp:nv.prev()){
                if (lp.node().next().size()>1 or lp.node().parallels().size()>1){
                    b=true;
                    break;
                }
                through.emplace_back(-lp.node().node_id(),fwn);
            }
            if (b) continue;

            ge.queue_node_expansion(nv.node_id(),through);
        }
    }
    ge.apply_all();
//    def collapse_into_inputs(g,e, max_collapsed_size=500):
//    """Finds all nodes representing only shared sequence at the end of previous nodes, collapses back, only queues operations"""
//    for nvf in g.get_all_nodeviews():
//        for nv in [nvf,nvf.rc()]:
//            if nv.size()>max_collapsed_size: continue #don't expand large nodes
//            if len(nv.prev())<=1 or len(nv.next())!=1: continue
//            b=False
//            for lp in nv.prev():
//                if len(lp.node().next())>1 or len(lp.node().parallels())>1: #a single conflicted prev node skips the expansion, could be solved partially?
//                    b=True
//                    break#don't expand after a bubble
//            if b: continue
//            #TODO: tip check? is it even needed now?
//            #print([[-x.node().node_id(), nv.next()[0].node().node_id()] for x in nv.prev()])
//            e.queue_node_expansion(nv.node_id(),[[-x.node().node_id(), nv.next()[0].node().node_id()] for x in nv.prev()])
}